

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(AS02_MCAConfigParser *this,Dictionary *d)

{
  MDDEntry *pMVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  char name_buf [64];
  char symbol_buf [64];
  label_traits local_2f0;
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  *local_2a8;
  _func_int **local_2a0;
  long *local_298;
  long local_290;
  long local_288 [7];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_250;
  byte_t local_1e2 [2];
  AS02_MCAConfigParser *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  byte_t abStack_1b8 [5];
  byte_t local_1b3 [3];
  byte_t abStack_1b0 [8];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  char local_78 [72];
  
  ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(&this->super_ASDCP_MCAConfigParser,d);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Mono One","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M1);
  local_88 = *(undefined4 *)pMVar1->ul;
  uStack_84 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_80 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_7c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_84,local_88),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_84 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_7c,uStack_80),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_7c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_7c >> 0x10,0);
  local_2a0 = (_func_int **)&PTR__IArchive_0021d318;
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb3ba,&local_2f0);
  local_2a8 = (_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
               *)&(this->super_ASDCP_MCAConfigParser).m_LabelMap;
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Mono Two","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M2);
  local_98 = *(undefined4 *)pMVar1->ul;
  uStack_94 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_90 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_8c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_94,local_98),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_94 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_8c,uStack_90),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_8c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_8c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb3cd,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Left Total","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lt);
  local_a8 = *(undefined4 *)pMVar1->ul;
  uStack_a4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_a0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_9c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_a4,local_a8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_a4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_9c,uStack_a0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_9c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_9c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb3e0,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Right Total","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rt);
  local_b8 = *(undefined4 *)pMVar1->ul;
  uStack_b4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_b0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_ac = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_b4,local_b8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_b4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_ac,uStack_b0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_ac >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_ac >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1ef364,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Left Surround Total","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lst);
  local_c8 = *(undefined4 *)pMVar1->ul;
  uStack_c4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_c0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_bc = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_c4,local_c8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_c4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_bc,uStack_c0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_bc >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_bc >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [4])0x1eb406,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Right Surround Total","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rst);
  local_d8 = *(undefined4 *)pMVar1->ul;
  uStack_d4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_d0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_cc = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_d4,local_d8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_d4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_cc,uStack_d0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_cc >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_cc >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [4])0x1eb41a,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Surround","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_S);
  local_e8 = *(undefined4 *)pMVar1->ul;
  uStack_e4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_e0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_dc = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_e4,local_e8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_e4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_dc,uStack_e0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_dc >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_dc >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [2])0x1ef35f,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Standard Stereo","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_ST);
  local_f8 = *(undefined4 *)pMVar1->ul;
  uStack_f4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_f0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_ec = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_f4,local_f8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_f4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_ec,uStack_f0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_ec >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_ec >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1f55a3,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Dual Mono","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DM);
  local_108 = *(undefined4 *)pMVar1->ul;
  uStack_104 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_100 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_fc = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_104,local_108),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_104 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_fc,uStack_100),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_fc >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_fc >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1ecfe9,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,"Discrete Numbered Sources","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DNS);
  local_118 = *(undefined4 *)pMVar1->ul;
  uStack_114 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_110 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_10c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_114,local_118),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_114 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_10c,uStack_110),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_10c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_10c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [4])0x1eb488,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"3.0","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_30);
  local_128 = *(undefined4 *)pMVar1->ul;
  uStack_124 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_120 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_11c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_124,local_128),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_124 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_11c,uStack_120),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_11c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_11c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb49f,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"4.0","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_40);
  local_138 = *(undefined4 *)pMVar1->ul;
  uStack_134 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_130 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_12c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_134,local_138),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_134 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_12c,uStack_130),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_12c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_12c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb4b5,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"5.0","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_50);
  local_148 = *(undefined4 *)pMVar1->ul;
  uStack_144 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_140 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_13c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_144,local_148),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_144 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_13c,uStack_140),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_13c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_13c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb4cb,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"6.0","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_60);
  local_158 = *(undefined4 *)pMVar1->ul;
  uStack_154 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_150 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_14c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_154,local_158),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_154 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_14c,uStack_150),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_14c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_14c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1eb4e1,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"7.0DS","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_70);
  local_168 = *(undefined4 *)pMVar1->ul;
  uStack_164 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_160 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_15c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_164,local_168),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_164 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_15c,uStack_160),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_15c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_15c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])0x1ed538,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Lt-Rt","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_LtRt);
  local_178 = *(undefined4 *)pMVar1->ul;
  uStack_174 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_170 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_16c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_174,local_178),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_174 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_16c,uStack_170),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_16c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_16c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [5])0x1eb50d,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"5.1EX","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_51EX);
  local_188 = *(undefined4 *)pMVar1->ul;
  uStack_184 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_180 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_17c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_184,local_188),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_184 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_17c,uStack_180),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_17c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_17c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [5])0x1eb525,&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Hearing Accessibility","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_HI);
  local_198 = *(undefined4 *)pMVar1->ul;
  uStack_194 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_190 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_18c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_194,local_198),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_194 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_18c,uStack_190),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_18c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_18c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])"HA",&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Visual Accessibility","");
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_VIN);
  local_1a8 = *(undefined4 *)pMVar1->ul;
  uStack_1a4 = *(undefined4 *)(pMVar1->ul + 4);
  uStack_1a0 = *(undefined4 *)(pMVar1->ul + 8);
  uStack_19c = *(undefined4 *)(pMVar1->ul + 0xc);
  local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_298,local_290 + (long)local_298);
  local_2f0.requires_prefix = true;
  local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
  local_2f0.ul.super_Identifier<16U>.m_Value._0_5_ = SUB85(CONCAT44(uStack_1a4,local_1a8),0);
  local_2f0.ul.super_Identifier<16U>.m_Value._5_3_ = SUB43((uint)uStack_1a4 >> 8,0);
  local_2f0.ul.super_Identifier<16U>.m_Value._8_5_ = SUB85(CONCAT44(uStack_19c,uStack_1a0),0);
  local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)((uint)uStack_19c >> 8);
  local_2f0.ul.super_Identifier<16U>.m_Value._14_2_ = SUB42((uint)uStack_19c >> 0x10,0);
  local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_250,(char (*) [3])"VA",&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            (local_2a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
    operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                    local_250.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
    operator_delete(local_250.first._M_dataplus._M_p,
                    local_250.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
    operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                    local_2f0.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  local_1e0 = this;
  pMVar1 = Dictionary::Type((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFNumberedSourceChannel)
  ;
  abStack_1b0._0_5_ = (undefined5)((ulong)*(undefined8 *)(pMVar1->ul + 5) >> 0x18);
  abStack_1b8 = SUB85(*(undefined8 *)pMVar1->ul,0);
  local_1b3 = SUB83((ulong)*(undefined8 *)pMVar1->ul >> 0x28,0);
  local_1e2 = *(byte_t (*) [2])(pMVar1->ul + 0xe);
  uVar4 = 1;
  do {
    snprintf((char *)&local_298,0x40,"Numbered Source Channel %03d",uVar4);
    snprintf(local_78,0x40,"NSC%03d",uVar4);
    local_1d8 = local_1c8;
    sVar2 = strlen((char *)&local_298);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,&local_298,(long)&local_298 + sVar2);
    local_2f0.tag_name._M_dataplus._M_p = (pointer)&local_2f0.tag_name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,local_1d8,local_1d0 + (long)local_1d8);
    local_2f0.requires_prefix = true;
    local_2f0.ul.super_Identifier<16U>.m_HasValue = true;
    local_2f0.ul.super_Identifier<16U>.m_Value[8] = abStack_1b0[0];
    local_2f0.ul.super_Identifier<16U>.m_Value[9] = abStack_1b0[1];
    local_2f0.ul.super_Identifier<16U>.m_Value[10] = abStack_1b0[2];
    local_2f0.ul.super_Identifier<16U>.m_Value[0xb] = abStack_1b0[3];
    local_2f0.ul.super_Identifier<16U>.m_Value[0xc] = abStack_1b0[4];
    local_2f0.ul.super_Identifier<16U>.m_Value[0] = abStack_1b8[0];
    local_2f0.ul.super_Identifier<16U>.m_Value[1] = abStack_1b8[1];
    local_2f0.ul.super_Identifier<16U>.m_Value[2] = abStack_1b8[2];
    local_2f0.ul.super_Identifier<16U>.m_Value[3] = abStack_1b8[3];
    local_2f0.ul.super_Identifier<16U>.m_Value[4] = abStack_1b8[4];
    local_2f0.ul.super_Identifier<16U>.m_Value[5] = local_1b3[0];
    local_2f0.ul.super_Identifier<16U>.m_Value[6] = local_1b3[1];
    local_2f0.ul.super_Identifier<16U>.m_Value[7] = local_1b3[2];
    local_2f0.ul.super_Identifier<16U>.m_Value[0xd] = (byte_t)uVar4;
    local_2f0.ul.super_Identifier<16U>.m_Value[0xe] = local_1e2[0];
    local_2f0.ul.super_Identifier<16U>.m_Value[0xf] = local_1e2[1];
    local_2f0.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_2a0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
    ::pair<char_(&)[64],_ASDCP::MXF::label_traits,_true>
              (&local_250,(char (*) [64])local_78,&local_2f0);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
              (local_2a8,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.second.tag_name._M_dataplus._M_p != &local_250.second.tag_name.field_2) {
      operator_delete(local_250.second.tag_name._M_dataplus._M_p,
                      local_250.second.tag_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.first._M_dataplus._M_p != &local_250.first.field_2) {
      operator_delete(local_250.first._M_dataplus._M_p,
                      local_250.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0.tag_name._M_dataplus._M_p != &local_2f0.tag_name.field_2) {
      operator_delete(local_2f0.tag_name._M_dataplus._M_p,
                      local_2f0.tag_name.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 0x80);
  return;
}

Assistant:

ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(const Dictionary* d) : ASDCP::MXF::ASDCP_MCAConfigParser(d)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("M1",    label_traits("Mono One",  true,  m_Dict->ul(MDD_IMFAudioChannel_M1))));
  m_LabelMap.insert(pair("M2",    label_traits("Mono Two",  true,  m_Dict->ul(MDD_IMFAudioChannel_M2))));
  m_LabelMap.insert(pair("Lt",    label_traits("Left Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Lt))));
  m_LabelMap.insert(pair("Rt",    label_traits("Right Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Rt))));
  m_LabelMap.insert(pair("Lst",   label_traits("Left Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Lst))));
  m_LabelMap.insert(pair("Rst",   label_traits("Right Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Rst))));
  m_LabelMap.insert(pair("S",     label_traits("Surround",   true,  m_Dict->ul(MDD_IMFAudioChannel_S))));
  m_LabelMap.insert(pair("ST",    label_traits("Standard Stereo",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_ST))));
  m_LabelMap.insert(pair("DM",    label_traits("Dual Mono",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_DM))));
  m_LabelMap.insert(pair("DNS",   label_traits("Discrete Numbered Sources", true,  m_Dict->ul(MDD_IMFAudioSoundfield_DNS))));
  m_LabelMap.insert(pair("30",    label_traits("3.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_30))));
  m_LabelMap.insert(pair("40",    label_traits("4.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_40))));
  m_LabelMap.insert(pair("50",    label_traits("5.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_50))));
  m_LabelMap.insert(pair("60",    label_traits("6.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_60))));
  m_LabelMap.insert(pair("70",    label_traits("7.0DS",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_70))));
  m_LabelMap.insert(pair("LtRt",  label_traits("Lt-Rt",true,  m_Dict->ul(MDD_IMFAudioSoundfield_LtRt))));
  m_LabelMap.insert(pair("51EX",  label_traits("5.1EX",true,  m_Dict->ul(MDD_IMFAudioSoundfield_51EX))));
  m_LabelMap.insert(pair("HA",    label_traits("Hearing Accessibility",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_HI))));
  m_LabelMap.insert(pair("VA",   label_traits("Visual Accessibility", true,  m_Dict->ul(MDD_IMFAudioSoundfield_VIN))));

  // assemble the  set of Numbered Source Channel labels
  char name_buf[64], symbol_buf[64];
  byte_t ul_buf[16];
  memcpy(ul_buf, m_Dict->ul(MDD_IMFNumberedSourceChannel), 16);

  for ( int i = 1; i < 128; ++i )
    {
      snprintf(name_buf, 64, "Numbered Source Channel %03d", i);
      snprintf(symbol_buf, 64, "NSC%03d", i);
      ul_buf[13] = i;
      m_LabelMap.insert(pair(symbol_buf, label_traits(name_buf, true, UL(ul_buf))));
    }
}